

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<bool> __thiscall
kj::HttpServer::listenHttpImpl(HttpServer *this,AsyncIoStream *connection,bool wantCleanDrain)

{
  int iVar1;
  _func_int **pp_Var2;
  Disposer *pDVar3;
  HttpService *pHVar4;
  undefined7 in_register_00000011;
  Own<kj::HttpService,_std::nullptr_t> srv;
  DebugComparison<kj::HttpService_*,_std::nullptr_t> _kjCondition;
  Fault f;
  undefined1 local_f0 [192];
  
  srv.disposer = (Disposer *)0x0;
  srv.ptr = (HttpService *)0x0;
  iVar1 = *(int *)&connection[1].super_AsyncOutputStream._vptr_AsyncOutputStream;
  if (iVar1 == 2) {
    pp_Var2 = connection[2].super_AsyncOutputStream._vptr_AsyncOutputStream;
    (**(code **)*pp_Var2)
              (&_kjCondition,pp_Var2,
               (SuspendableHttpServiceFactory *)CONCAT71(in_register_00000011,wantCleanDrain));
    Own<kj::HttpService,_std::nullptr_t>::operator=
              (&srv,(Own<kj::HttpService,_std::nullptr_t> *)&_kjCondition);
    Own<kj::HttpService,_std::nullptr_t>::dispose
              ((Own<kj::HttpService,_std::nullptr_t> *)&_kjCondition);
  }
  else if (iVar1 == 1) {
    _kjCondition.right = connection[2].super_AsyncInputStream._vptr_AsyncInputStream;
    _kjCondition.left = (HttpService *)&NullDisposer::instance;
    Own<kj::HttpService,_std::nullptr_t>::operator=
              (&srv,(Own<kj::HttpService,_std::nullptr_t> *)&_kjCondition);
    Own<kj::HttpService,_std::nullptr_t>::dispose
              ((Own<kj::HttpService,_std::nullptr_t> *)&_kjCondition);
  }
  pHVar4 = srv.ptr;
  pDVar3 = srv.disposer;
  _kjCondition.right = (void *)0x0;
  _kjCondition.left = srv.ptr;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = srv.ptr != (HttpService *)0x0;
  if (_kjCondition.result) {
    _kjCondition.left = (HttpService *)srv.disposer;
    _kjCondition.right = srv.ptr;
    srv.ptr = (HttpService *)0x0;
    local_f0._8_8_ = operator_new(0x18);
    *(undefined ***)local_f0._8_8_ = &PTR_operator___005942c0;
    _kjCondition.right = (void *)0x0;
    *(Disposer **)(local_f0._8_8_ + 8) = pDVar3;
    *(HttpService **)(local_f0._8_8_ + 0x10) = pHVar4;
    local_f0._0_8_ =
         &kj::_::
          HeapDisposer<kj::Function<kj::Maybe<kj::Own<kj::HttpService,decltype(nullptr)>>(kj::HttpServer::SuspendableRequest&)>::Impl<kj::HttpServer::listenHttpImpl(kj::AsyncIoStream&,bool)::$_0>>
          ::instance;
    local_f0[0x10] = 0;
    listenHttpImpl(this,connection,
                   (SuspendableHttpServiceFactory *)CONCAT71(in_register_00000011,wantCleanDrain),
                   (Maybe<kj::HttpServer::SuspendedRequest> *)local_f0,
                   (bool)((char)local_f0 + '\x10'));
    kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::~NullableValue
              ((NullableValue<kj::HttpServer::SuspendedRequest> *)(local_f0 + 0x10));
    Own<kj::Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>::Iface,_std::nullptr_t>
    ::dispose((Own<kj::Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>::Iface,_std::nullptr_t>
               *)local_f0);
    Own<kj::HttpService,_std::nullptr_t>::dispose
              ((Own<kj::HttpService,_std::nullptr_t> *)&_kjCondition);
    Own<kj::HttpService,_std::nullptr_t>::dispose(&srv);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::HttpService*,decltype(nullptr)>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fff,FAILED,"srv.get() != nullptr","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Promise<bool> HttpServer::listenHttpImpl(kj::AsyncIoStream& connection, bool wantCleanDrain) {
  kj::Own<HttpService> srv;

  KJ_SWITCH_ONEOF(service) {
    KJ_CASE_ONEOF(ptr, HttpService*) {
      // Fake Own okay because we can assume the HttpService outlives this HttpServer, and we can
      // assume `this` HttpServer outlives the returned `listenHttpCleanDrain()` promise, which will
      // own the fake Own.
      srv = kj::Own<HttpService>(ptr, kj::NullDisposer::instance);
    }
    KJ_CASE_ONEOF(func, HttpServiceFactory) {
      srv = func(connection);
    }
  }

  KJ_ASSERT(srv.get() != nullptr);

  return listenHttpImpl(connection, [srv = kj::mv(srv)](SuspendableRequest&) mutable {
    // This factory function will be owned by the Connection object, meaning the Connection object
    // will own the HttpService. We also know that the Connection object outlives all
    // service.request() promises (service.request() is called from a Connection member function).
    // The Owns we return from this function are attached to the service.request() promises,
    // meaning this factory function will outlive all Owns we return. So, it's safe to return a fake
    // Own.
    return kj::Own<HttpService>(srv.get(), kj::NullDisposer::instance);
  }, kj::none /* suspendedRequest */, wantCleanDrain);
}